

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.cpp
# Opt level: O0

Track * complete(Track *track)

{
  Sector *this;
  bool bVar1;
  int iVar2;
  DataList *this_00;
  allocator<unsigned_char> local_51;
  Data local_50;
  Sector *local_38;
  Sector *sector;
  iterator __end1;
  iterator __begin1;
  Track *__range1;
  Track *pTStack_10;
  uint8_t fill;
  Track *track_local;
  
  __range1._7_1_ = '\0';
  pTStack_10 = track;
  __end1 = Track::begin(track);
  sector = (Sector *)Track::end(track);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                                     *)&sector), bVar1) {
    local_38 = __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
               ::operator*(&__end1);
    iVar2 = Sector::copies(local_38);
    this = local_38;
    if (iVar2 == 0) {
      iVar2 = Sector::size(local_38);
      std::allocator<unsigned_char>::allocator(&local_51);
      Data::vector(&local_50,(long)iVar2,(value_type *)((long)&__range1 + 7),&local_51);
      Sector::add(this,&local_50,false,0xfb);
      Data::~Data(&local_50);
      std::allocator<unsigned_char>::~allocator(&local_51);
    }
    else {
      iVar2 = Sector::data_size(local_38);
      if (iVar2 == 0) {
        this_00 = Sector::datas(local_38);
        std::vector<Data,_std::allocator<Data>_>::clear(this_00);
      }
    }
    __range1._7_1_ = __range1._7_1_ + '\x01';
    __gnu_cxx::__normal_iterator<Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
    operator++(&__end1);
  }
  return pTStack_10;
}

Assistant:

static Track& complete(Track& track)
{
    uint8_t fill = 0;

    for (auto& sector : track)
    {
        // Add test data to sectors that lack it
        if (!sector.copies())
            sector.add(Data(sector.size(), fill));

        // Remove data from sectors with 0 bytes of data (for no-data sectors)
        else if (!sector.data_size())
            sector.datas().clear();

        ++fill;
    }

    return track;
}